

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefaultFunctionPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultFunctionPortSyntax,slang::syntax::DefaultFunctionPortSyntax_const&>
          (BumpAllocator *this,DefaultFunctionPortSyntax *args)

{
  SyntaxNode *pSVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  DefaultFunctionPortSyntax *pDVar8;
  
  pDVar8 = (DefaultFunctionPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultFunctionPortSyntax *)this->endPtr < pDVar8 + 1) {
    pDVar8 = (DefaultFunctionPortSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pDVar8 + 1);
  }
  (pDVar8->keyword).info = (args->keyword).info;
  SVar6 = (args->super_FunctionPortBaseSyntax).super_SyntaxNode.kind;
  uVar7 = *(undefined4 *)&(args->super_FunctionPortBaseSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_FunctionPortBaseSyntax).super_SyntaxNode.parent;
  TVar2 = (args->keyword).kind;
  uVar3 = (args->keyword).field_0x2;
  NVar4.raw = (args->keyword).numFlags.raw;
  uVar5 = (args->keyword).rawLen;
  (pDVar8->super_FunctionPortBaseSyntax).super_SyntaxNode.previewNode =
       (args->super_FunctionPortBaseSyntax).super_SyntaxNode.previewNode;
  (pDVar8->keyword).kind = TVar2;
  (pDVar8->keyword).field_0x2 = uVar3;
  (pDVar8->keyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (pDVar8->keyword).rawLen = uVar5;
  (pDVar8->super_FunctionPortBaseSyntax).super_SyntaxNode.kind = SVar6;
  *(undefined4 *)&(pDVar8->super_FunctionPortBaseSyntax).super_SyntaxNode.field_0x4 = uVar7;
  (pDVar8->super_FunctionPortBaseSyntax).super_SyntaxNode.parent = pSVar1;
  return pDVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }